

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

string * __thiscall
flatbuffers::FlatBufMethod::get_output_type_name_abi_cxx11_
          (string *__return_storage_ptr__,FlatBufMethod *this)

{
  StructDef *pSVar1;
  pointer pcVar2;
  
  pSVar1 = this->method_->response;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pSVar1->super_Definition).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pSVar1->super_Definition).name._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string get_output_type_name() const { return (*method_->response).name; }